

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleformatter.h
# Opt level: O3

UnicodeString * __thiscall
icu_63::SimpleFormatter::getTextWithNoArguments
          (UnicodeString *__return_storage_ptr__,SimpleFormatter *this)

{
  ushort uVar1;
  char16_t *compiledPattern;
  int32_t compiledPatternLength;
  
  uVar1 = (this->compiledPattern).fUnion.fStackFields.fLengthAndFlags;
  if ((uVar1 & 0x11) == 0) {
    if ((uVar1 & 2) == 0) {
      compiledPattern = (this->compiledPattern).fUnion.fFields.fArray;
    }
    else {
      compiledPattern = (this->compiledPattern).fUnion.fStackFields.fBuffer;
    }
  }
  else {
    compiledPattern = (char16_t *)0x0;
  }
  if ((short)uVar1 < 0) {
    compiledPatternLength = (this->compiledPattern).fUnion.fFields.fLength;
  }
  else {
    compiledPatternLength = (int)(short)uVar1 >> 5;
  }
  getTextWithNoArguments(__return_storage_ptr__,compiledPattern,compiledPatternLength);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString getTextWithNoArguments() const {
        return getTextWithNoArguments(compiledPattern.getBuffer(), compiledPattern.length());
    }